

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

void * Fossilize::build_pnext_chain
                 (VulkanProperties *props,uint32_t api_version,char **enabled_extensions,
                 uint32_t extension_count)

{
  uint32_t uVar1;
  VulkanProperties *pVVar2;
  size_type sVar3;
  ulong uVar4;
  void **ppvVar5;
  VulkanProperties *pVVar6;
  bool bVar7;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_set;
  allocator local_95;
  uint32_t local_94;
  value_type local_90;
  VulkanProperties *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_94 = api_version;
  local_70 = props;
  memset(props,0,0x3d0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  for (uVar4 = 0; extension_count != uVar4; uVar4 = uVar4 + 1) {
    std::__cxx11::string::string((string *)&local_90,enabled_extensions[uVar4],&local_95);
    std::__detail::
    _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&local_68,&local_90);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_descriptor_indexing",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  pVVar2 = local_70;
  uVar1 = local_94;
  ppvVar5 = (void **)0x0;
  if (local_94 < 0x400000) {
    pVVar6 = (VulkanProperties *)0x0;
  }
  else {
    pVVar6 = (VulkanProperties *)0x0;
    if (sVar3 != 0) {
      (local_70->descriptor_indexing).sType =
           VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_PROPERTIES;
      ppvVar5 = &(local_70->descriptor_indexing).pNext;
      pVVar6 = local_70;
    }
  }
  if (0x400fff < local_94) {
    (local_70->subgroup).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&local_70->subgroup;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &local_70->subgroup;
    }
    ppvVar5 = &(local_70->subgroup).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_shader_float_controls",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->float_control).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT_CONTROLS_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->float_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->float_control;
    }
    ppvVar5 = &(pVVar2->float_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_depth_stencil_resolve",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ds_resolve).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_STENCIL_RESOLVE_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->ds_resolve;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ds_resolve;
    }
    ppvVar5 = &(pVVar2->ds_resolve).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_multiview",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->multiview).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->multiview;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->multiview;
    }
    ppvVar5 = &(pVVar2->multiview).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_fragment_shading_rate",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->fragment_shading_rate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_PROPERTIES_KHR;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->fragment_shading_rate;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->fragment_shading_rate;
    }
    ppvVar5 = &(pVVar2->fragment_shading_rate).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_ray_tracing_pipeline",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->ray_tracing_pipeline).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_PROPERTIES_KHR;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->ray_tracing_pipeline;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->ray_tracing_pipeline;
    }
    ppvVar5 = &(pVVar2->ray_tracing_pipeline).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_acceleration_structure",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->acceleration_structure).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_PROPERTIES_KHR;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->acceleration_structure;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->acceleration_structure;
    }
    ppvVar5 = &(pVVar2->acceleration_structure).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_subgroup_size_control",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->subgroup_size_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->subgroup_size_control;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->subgroup_size_control;
    }
    ppvVar5 = &(pVVar2->subgroup_size_control).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_inline_uniform_block",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->inline_uniform_block).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->inline_uniform_block;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->inline_uniform_block;
    }
    ppvVar5 = &(pVVar2->inline_uniform_block).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_vertex_attribute_divisor",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_90,"VK_KHR_vertex_attribute_divisor",&local_95);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&local_68,&local_90);
    bVar7 = sVar3 == 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  uVar1 = local_94;
  if ((0x3fffff < local_94) && (!bVar7)) {
    (pVVar2->attribute_divisor).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->attribute_divisor;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->attribute_divisor;
    }
    ppvVar5 = &(pVVar2->attribute_divisor).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_push_descriptor",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->push_descriptor).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PUSH_DESCRIPTOR_PROPERTIES;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->push_descriptor;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->push_descriptor;
    }
    ppvVar5 = &(pVVar2->push_descriptor).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_sample_locations",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->sample_locations).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLE_LOCATIONS_PROPERTIES_EXT;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->sample_locations;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->sample_locations;
    }
    ppvVar5 = &(pVVar2->sample_locations).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_extended_dynamic_state3",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->extended_dynamic_state3).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_PROPERTIES_EXT;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->extended_dynamic_state3;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->extended_dynamic_state3;
    }
    ppvVar5 = &(pVVar2->extended_dynamic_state3).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_mesh_shader",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->mesh_shader).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_PROPERTIES_EXT;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->mesh_shader;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->mesh_shader;
    }
    ppvVar5 = &(pVVar2->mesh_shader).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_shader_module_identifier",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->shader_module_identifier).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->shader_module_identifier;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->shader_module_identifier;
    }
    ppvVar5 = &(pVVar2->shader_module_identifier).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_EXT_blend_operation_advanced",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->blend_operation_advanced).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_PROPERTIES_EXT;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->blend_operation_advanced;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->blend_operation_advanced;
    }
    ppvVar5 = &(pVVar2->blend_operation_advanced).pNext;
  }
  std::__cxx11::string::string((string *)&local_90,"VK_KHR_maintenance7",&local_95);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&local_68,&local_90);
  std::__cxx11::string::_M_dispose();
  if ((0x3fffff < uVar1) && (sVar3 != 0)) {
    (pVVar2->maintenance7).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_PROPERTIES_KHR;
    if (pVVar6 == (VulkanProperties *)0x0) {
      pVVar6 = (VulkanProperties *)&pVVar2->maintenance7;
    }
    if (ppvVar5 != (void **)0x0) {
      *ppvVar5 = &pVVar2->maintenance7;
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return pVVar6;
}

Assistant:

void *build_pnext_chain(VulkanProperties &props, uint32_t api_version,
                        const char **enabled_extensions, uint32_t extension_count)
{
	props = {};
	void *pNext = nullptr;
	void **ppNext = nullptr;

	std::unordered_set<std::string> enabled_extension_set;
	for (uint32_t i = 0; i < extension_count; i++)
		enabled_extension_set.insert(enabled_extensions[i]);

#define CHAIN(struct_type, member, min_api_version, required_extension, required_extension_alias) \
	do { \
		bool is_minimum_api_version = api_version >= min_api_version; \
		bool supports_extension = required_extension == nullptr || enabled_extension_set.count(required_extension) != 0; \
		if (!supports_extension && required_extension_alias) \
			supports_extension = enabled_extension_set.count(required_extension_alias) != 0; \
		if (supports_extension && is_minimum_api_version) { \
			member.sType = struct_type; \
			if (!pNext) pNext = &member; \
			if (ppNext) *ppNext = &member; \
			ppNext = &member.pNext; \
		} \
	} while (0)

#define P(struct_type, member, minimum_api_version, required_extension) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES, props.member, \
	VK_API_VERSION_##minimum_api_version, VK_##required_extension##_EXTENSION_NAME, nullptr)
#define P_CORE(struct_type, member, minimum_api_version) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES, props.member, \
	VK_API_VERSION_##minimum_api_version, nullptr, nullptr)
#define PE(struct_type, member, ext) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext, props.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, nullptr)
#define PE_ALIAS(struct_type, member, ext, ext_alias) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext, props.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, VK_##ext##_##struct_type##_EXTENSION_NAME)

#include "fossilize_feature_filter_properties.inc"

#undef CHAIN
#undef P
#undef P_CORE
#undef PE
#undef PE_ALIAS

	return pNext;
}